

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

Node * __thiscall
TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::NewKey
          (TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_> *this,int key)

{
  Node *pNVar1;
  IPair IVar2;
  Node *pNVar3;
  uint uVar4;
  Node *pNVar5;
  uint uVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node *pNVar9;
  
  pNVar3 = this->Nodes;
  uVar4 = this->Size - 1;
  uVar6 = uVar4 & key;
  pNVar9 = pNVar3 + uVar6;
  pNVar5 = pNVar3[uVar6].Next;
  if (pNVar5 == (Node *)0x1) {
    pNVar9->Next = (Node *)0x0;
  }
  else {
    pNVar1 = this->LastFree;
    do {
      pNVar7 = pNVar1 + -1;
      pNVar8 = (Node *)0x0;
      if (pNVar1 <= pNVar3) break;
      pNVar8 = pNVar7;
      pNVar1 = pNVar7;
    } while (pNVar7->Next != (Node *)0x1);
    this->LastFree = pNVar7;
    if (pNVar8 == (Node *)0x0) {
      Resize(this,this->Size * 2);
      pNVar3 = NewKey(this,key);
    }
    else {
      uVar4 = uVar4 & (pNVar9->Pair).Key;
      if (uVar4 == uVar6) {
        pNVar8->Next = pNVar5;
        pNVar3 = pNVar8;
        pNVar5 = pNVar8;
      }
      else {
        pNVar3 = pNVar3 + uVar4;
        do {
          pNVar5 = pNVar3;
          pNVar3 = pNVar5->Next;
        } while (pNVar3 != pNVar9);
        pNVar5->Next = pNVar8;
        IVar2 = pNVar9->Pair;
        pNVar8->Next = pNVar9->Next;
        pNVar8->Pair = IVar2;
        pNVar3 = (Node *)0x0;
        pNVar5 = pNVar9;
      }
      pNVar9->Next = pNVar3;
      pNVar9 = pNVar5;
    }
    if (pNVar8 == (Node *)0x0) {
      return pNVar3;
    }
  }
  this->NumUsed = this->NumUsed + 1;
  (pNVar9->Pair).Key = key;
  return pNVar9;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}